

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O0

unique_ptr<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>,_std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>_>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>,so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>>>
          (stdcpp *this,
          outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>_>
          *args)

{
  default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>
  *this_00;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>
  local_20 [8];
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>_>
  *local_18;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>_>
  *args_local;
  
  local_18 = args;
  args_local = (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>_>
                *)this;
  this_00 = (default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>
             *)operator_new(0x10);
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>
  ::
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>>
            (local_20,local_18);
  env_infrastructures::st_reusable_stuff::
  default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>
  ::default_disp_binder_t
            (this_00,(outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>
                      *)local_20);
  std::
  unique_ptr<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>,std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>>>
  ::
  unique_ptr<std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>>,void>
            ((unique_ptr<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>,std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>>>>
              *)this,this_00);
  return (__uniq_ptr_data<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>,_std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>_>,_true,_true>
          )(__uniq_ptr_data<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>,_std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}